

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O2

iterator __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::FindBasicBlockPosition
          (LoopUnswitch *this,BasicBlock *bb_to_find)

{
  Function *this_00;
  uint32_t bb_id;
  iterator iVar1;
  
  this_00 = this->function_;
  bb_id = BasicBlock::id(bb_to_find);
  iVar1 = Function::FindBlock(this_00,bb_id);
  if ((iVar1.container_ == &this->function_->blocks_) &&
     (iVar1.iterator_._M_current._M_current ==
      (this->function_->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("it != function_->end() && \"Basic Block not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x57,
                  "Function::iterator spvtools::opt::(anonymous namespace)::LoopUnswitch::FindBasicBlockPosition(BasicBlock *)"
                 );
  }
  return iVar1;
}

Assistant:

Function::iterator FindBasicBlockPosition(BasicBlock* bb_to_find) {
    Function::iterator it = function_->FindBlock(bb_to_find->id());
    assert(it != function_->end() && "Basic Block not found");
    return it;
  }